

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

int xmlTextReaderValidatePop(xmlTextReaderPtr reader)

{
  int *piVar1;
  xmlNodePtr elem;
  xmlParserCtxtPtr pxVar2;
  uint uVar3;
  xmlTextReaderValidate xVar4;
  int iVar5;
  xmlChar *pxVar6;
  xmlChar buf [50];
  xmlChar axStack_68 [64];
  
  elem = reader->node;
  xVar4 = reader->validate;
  if (xVar4 == XML_TEXTREADER_VALIDATE_DTD) {
    pxVar2 = reader->ctxt;
    if ((pxVar2 != (xmlParserCtxtPtr)0x0) && (pxVar2->validate == 1)) {
      if ((elem->ns == (xmlNs *)0x0) || (pxVar6 = elem->ns->prefix, pxVar6 == (xmlChar *)0x0)) {
        uVar3 = xmlValidatePopElement(&pxVar2->vctxt,pxVar2->myDoc,elem,elem->name);
        piVar1 = &reader->ctxt->valid;
        *piVar1 = *piVar1 & uVar3;
      }
      else {
        pxVar6 = xmlBuildQName(elem->name,pxVar6,axStack_68,0x32);
        if (pxVar6 == (xmlChar *)0x0) {
          xmlTextReaderErrMemory(reader);
          return -1;
        }
        uVar3 = xmlValidatePopElement(&reader->ctxt->vctxt,reader->ctxt->myDoc,elem,pxVar6);
        piVar1 = &reader->ctxt->valid;
        *piVar1 = *piVar1 & uVar3;
        if (pxVar6 != axStack_68) {
          (*xmlFree)(pxVar6);
        }
      }
    }
    xVar4 = reader->validate;
  }
  if ((xVar4 == XML_TEXTREADER_VALIDATE_RNG) &&
     (reader->rngValidCtxt != (xmlRelaxNGValidCtxtPtr)0x0)) {
    if (reader->rngFullNode == (xmlNodePtr)0x0) {
      iVar5 = xmlRelaxNGValidatePopElement(reader->rngValidCtxt,reader->ctxt->myDoc,elem);
      if (iVar5 != 1) {
        reader->rngValidErrors = reader->rngValidErrors + 1;
      }
    }
    else if (elem == reader->rngFullNode) {
      reader->rngFullNode = (xmlNodePtr)0x0;
    }
  }
  return 0;
}

Assistant:

static int
xmlTextReaderValidatePop(xmlTextReaderPtr reader) {
    xmlNodePtr node = reader->node;

#ifdef LIBXML_VALID_ENABLED
    if ((reader->validate == XML_TEXTREADER_VALIDATE_DTD) &&
        (reader->ctxt != NULL) && (reader->ctxt->validate == 1)) {
	if ((node->ns == NULL) || (node->ns->prefix == NULL)) {
	    reader->ctxt->valid &= xmlValidatePopElement(&reader->ctxt->vctxt,
				    reader->ctxt->myDoc, node, node->name);
	} else {
            xmlChar buf[50];
	    xmlChar *qname;

	    qname = xmlBuildQName(node->name, node->ns->prefix, buf, 50);
            if (qname == NULL) {
                xmlTextReaderErrMemory(reader);
                return(-1);
            }
	    reader->ctxt->valid &= xmlValidatePopElement(&reader->ctxt->vctxt,
				    reader->ctxt->myDoc, node, qname);
            if (qname != buf)
	        xmlFree(qname);
	}
        /*if (reader->ctxt->errNo == XML_ERR_NO_MEMORY) {
            reader->mode = XML_TEXTREADER_MODE_ERROR;
            reader->state = XML_TEXTREADER_ERROR;
            return(-1);
        }*/
    }
#endif /* LIBXML_VALID_ENABLED */
#ifdef LIBXML_SCHEMAS_ENABLED
    if ((reader->validate == XML_TEXTREADER_VALIDATE_RNG) &&
               (reader->rngValidCtxt != NULL)) {
	int ret;

	if (reader->rngFullNode != NULL) {
	    if (node == reader->rngFullNode)
	        reader->rngFullNode = NULL;
	    return(0);
	}
	ret = xmlRelaxNGValidatePopElement(reader->rngValidCtxt,
	                                   reader->ctxt->myDoc,
					   node);
	if (ret != 1)
	    reader->rngValidErrors++;
    }
#endif

    return(0);
}